

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,avx *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  PrimInfo *pPVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  anon_class_8_1_898bcfc2_conflict5 aVar5;
  runtime_error *prVar6;
  ulong uVar7;
  ulong uVar8;
  intrusive_list_node *piVar9;
  long lVar10;
  MemoryMonitorInterface *pMVar11;
  ulong uVar12;
  ulong uVar13;
  undefined7 in_register_00000081;
  long lVar14;
  anon_class_48_6_afa08d2e *paVar15;
  ulong uVar16;
  ulong uVar17;
  Iterator2 iter;
  size_t taskCount;
  anon_class_8_1_a89d07ac primitiveArea;
  anon_class_8_1_78f12065 split_primitive;
  TriangleSplitterFactory Splitter;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd1f8;
  undefined1 local_2e00 [16];
  Scene *local_2df0;
  char local_2de8;
  avx *local_2de0;
  undefined1 *local_2dd8;
  anon_class_8_1_898bcfc2_conflict5 local_2dd0;
  undefined1 local_2dc8 [24];
  undefined1 *puStack_2db0;
  intrusive_list_node local_2da8;
  intrusive_list_node local_2d98;
  intrusive_list_node local_2d88;
  PrimInfo *local_2d70;
  size_t local_2d68;
  avx *local_2d60;
  auto_partitioner *local_2d58;
  undefined1 *local_2d50;
  avx *local_2d48;
  anon_class_48_6_afa08d2e *local_2d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2d38;
  undefined1 *local_2d30;
  undefined1 *local_2d28;
  avx **local_2d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d18;
  undefined4 local_2d08;
  undefined4 uStack_2d04;
  undefined4 uStack_2d00;
  undefined4 uStack_2cfc;
  undefined4 local_2cf8;
  undefined4 uStack_2cf4;
  undefined4 uStack_2cf0;
  undefined4 uStack_2cec;
  undefined4 local_2ce8;
  undefined4 uStack_2ce4;
  undefined4 uStack_2ce0;
  undefined4 uStack_2cdc;
  intrusive_list_node local_2cd8;
  task_group_context local_2cc8;
  MemoryMonitorInterface local_2c48;
  long local_2c40 [63];
  ulong local_2a48 [64];
  anon_class_48_6_afa08d2e *local_2848;
  ulong local_2840;
  MemoryMonitorInterface local_13f8 [633];
  
  local_2de0 = (avx *)CONCAT71(in_register_00000081,mblur);
  local_2848 = (anon_class_48_6_afa08d2e *)0x0;
  local_2de8 = (char)types;
  uVar16 = 0;
  local_2e00._8_8_ = this;
  local_2df0 = scene;
  local_2d70 = __return_storage_ptr__;
  local_2d60 = this;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)();
  if (*(long *)(local_2e00._8_8_ + 0x1d8) != 0) {
    uVar16 = 0;
    lVar14 = 0;
    do {
      lVar10 = *(long *)(*(long *)(local_2e00._8_8_ + 0x1e8) + lVar14 * 8);
      if ((((lVar10 == 0) || ((*(uint *)(lVar10 + 0x3c) >> 0x15 & 1) == 0)) ||
          (((ulong)local_2df0 & (long)(1 << ((byte)*(uint *)(lVar10 + 0x3c) & 0x1f))) == 0)) ||
         ((bool)local_2de8 != (*(int *)(lVar10 + 0x24) != 1))) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)*(uint *)(lVar10 + 0x20);
      }
      uVar16 = uVar16 + uVar7;
      lVar14 = lVar14 + 1;
    } while (*(long *)(local_2e00._8_8_ + 0x1d8) != lVar14);
  }
  local_2840 = uVar16;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar7 = uVar16 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar7) {
    uVar7 = (long)iVar3;
  }
  uVar13 = 0x40;
  if (uVar7 < 0x40) {
    uVar13 = uVar7;
  }
  local_2848 = (anon_class_48_6_afa08d2e *)(uVar13 + (uVar13 == 0));
  local_2c48._vptr_MemoryMonitorInterface = (_func_int **)0x0;
  local_2a48[0] = 0;
  if (1 < uVar7) {
    uVar13 = 0;
    uVar7 = uVar16 / (ulong)local_2848;
    paVar15 = (anon_class_48_6_afa08d2e *)0x1;
    lVar14 = 0;
    do {
      lVar10 = *(long *)(*(long *)(local_2e00._8_8_ + 0x1e8) + lVar14 * 8);
      if (((lVar10 == 0) || ((*(uint *)(lVar10 + 0x3c) >> 0x15 & 1) == 0)) ||
         ((((ulong)local_2df0 & (long)(1 << ((byte)*(uint *)(lVar10 + 0x3c) & 0x1f))) == 0 ||
          ((bool)local_2de8 != (*(int *)(lVar10 + 0x24) != 1))))) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)*(uint *)(lVar10 + 0x20);
      }
      if (uVar12 == 0) {
        lVar10 = 0;
      }
      else {
        uVar8 = (long)((long)&paVar15->state + 1U) * uVar16;
        lVar10 = 0;
        uVar17 = 0;
        do {
          uVar4 = uVar7;
          uVar7 = uVar4;
          if ((uVar13 + uVar12 + lVar10 < uVar4) || (local_2848 <= paVar15)) break;
          *(long *)((long)local_2c40 + ((long)(paVar15 + 0xffffffffffffffff) + 0x2fU) * 8) = lVar14;
          uVar17 = uVar17 + (uVar4 - uVar13);
          *(ulong *)((long)local_2a48 + (long)paVar15 * 8) = uVar17;
          paVar15 = (anon_class_48_6_afa08d2e *)((long)&paVar15->state + 1);
          uVar7 = uVar8 / (ulong)local_2848;
          lVar10 = -uVar17;
          uVar8 = uVar8 + uVar16;
          uVar13 = uVar4;
        } while (uVar17 < uVar12);
      }
      uVar13 = uVar13 + uVar12 + lVar10;
      lVar14 = lVar14 + 1;
    } while (paVar15 < local_2848);
  }
  paVar15 = local_2848;
  local_2d18.m128[0] = INFINITY;
  local_2d18.m128[1] = INFINITY;
  local_2d18.m128[2] = INFINITY;
  local_2d18.m128[3] = INFINITY;
  local_2d08 = 0xff800000;
  uStack_2d04 = 0xff800000;
  uStack_2d00 = 0xff800000;
  uStack_2cfc = 0xff800000;
  local_2cf8 = 0x7f800000;
  uStack_2cf4 = 0x7f800000;
  uStack_2cf0 = 0x7f800000;
  uStack_2cec = 0x7f800000;
  local_2ce8 = 0xff800000;
  uStack_2ce4 = 0xff800000;
  uStack_2ce0 = 0xff800000;
  uStack_2cdc = 0xff800000;
  local_2cd8 = (intrusive_list_node)(ZEXT816(0) << 0x20);
  local_2d48 = (avx *)&local_2dd8;
  local_2e00._0_8_ = local_2e00 + 8;
  local_2dc8._8_8_ = &local_2dd0;
  local_2dc8._0_8_ = &local_2c48;
  puStack_2db0 = local_2e00;
  local_2dc8._16_8_ = &local_2d18;
  local_2da8.my_next_node = (intrusive_list_node *)&local_2d48;
  local_2da8.my_prev_node = (intrusive_list_node *)&stack0xffffffffffffd1fe;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2dd8 = (undefined1 *)numPrimRefs;
  local_2dd0.func = local_2848;
  local_2d40 = (anon_class_48_6_afa08d2e *)local_2e00._0_8_;
  local_2cc8.my_node = local_2cd8;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2d58 = (auto_partitioner *)local_2dc8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)paVar15,1,(anon_class_8_1_898bcfc2_conflict5 *)&local_2d58,
             (auto_partitioner *)&local_2d68,&local_2cc8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar2 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"task cancelled");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  local_2dc8._4_4_ = local_2d18.m128[1];
  local_2dc8._0_4_ = local_2d18.m128[0];
  local_2dc8._8_4_ = local_2d18.m128[2];
  local_2dc8._12_4_ = local_2d18.m128[3];
  local_2dc8._20_4_ = uStack_2d04;
  local_2dc8._16_4_ = local_2d08;
  unique0x10000576 = uStack_2d00;
  unique0x1000057a = uStack_2cfc;
  local_2da8.my_prev_node._4_4_ = uStack_2cf4;
  local_2da8.my_prev_node._0_4_ = local_2cf8;
  local_2da8.my_next_node._0_4_ = uStack_2cf0;
  local_2da8.my_next_node._4_4_ = uStack_2cec;
  local_2d98.my_prev_node._4_4_ = uStack_2ce4;
  local_2d98.my_prev_node._0_4_ = local_2ce8;
  local_2d98.my_next_node._0_4_ = uStack_2ce0;
  local_2d98.my_next_node._4_4_ = uStack_2cdc;
  local_2d88 = local_2cd8;
  if (local_2dd0.func != (anon_class_48_6_afa08d2e *)0x0) {
    pMVar11 = local_13f8;
    aVar5.func = local_2dd0.func;
    do {
      *(undefined1 (*) [16])(pMVar11 + -8) = local_2dc8._0_16_;
      *(intrusive_list_node *)(pMVar11 + -6) = unique0x100003ee;
      *(intrusive_list_node *)(pMVar11 + -4) = local_2da8;
      *(intrusive_list_node *)(pMVar11 + -2) = local_2d98;
      pMVar11->_vptr_MemoryMonitorInterface = (_func_int **)local_2d88.my_prev_node;
      pMVar11[1]._vptr_MemoryMonitorInterface = (_func_int **)local_2d88.my_next_node;
      local_2dc8._0_16_ = vminps_avx(local_2dc8._0_16_,*(undefined1 (*) [16])(pMVar11 + -0x288));
      unique0x000f2b00 =
           (intrusive_list_node)
           vmaxps_avx((undefined1  [16])unique0x100003ee,*(undefined1 (*) [16])(pMVar11 + -0x286));
      local_2da8 = (intrusive_list_node)
                   vminps_avx((undefined1  [16])local_2da8,*(undefined1 (*) [16])(pMVar11 + -0x284))
      ;
      local_2d98 = (intrusive_list_node)
                   vmaxps_avx((undefined1  [16])local_2d98,*(undefined1 (*) [16])(pMVar11 + -0x282))
      ;
      local_2d88 = (intrusive_list_node)
                   vpaddq_avx((undefined1  [16])local_2d88,*(undefined1 (*) [16])(pMVar11 + -0x280))
      ;
      pMVar11 = pMVar11 + 10;
      aVar5.func = (anon_class_48_6_afa08d2e *)((long)&aVar5.func[-1].func + 7);
    } while (aVar5.func != (anon_class_48_6_afa08d2e *)0x0);
  }
  if ((avx *)((long)local_2d88.my_next_node - (long)local_2d88.my_prev_node) != local_2de0) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    paVar15 = local_2848;
    local_2d18.m128[0] = INFINITY;
    local_2d18.m128[1] = INFINITY;
    local_2d18.m128[2] = INFINITY;
    local_2d18.m128[3] = INFINITY;
    local_2d08 = 0xff800000;
    uStack_2d04 = 0xff800000;
    uStack_2d00 = 0xff800000;
    uStack_2cfc = 0xff800000;
    local_2cf8 = 0x7f800000;
    uStack_2cf4 = 0x7f800000;
    uStack_2cf0 = 0x7f800000;
    uStack_2cec = 0x7f800000;
    local_2ce8 = 0xff800000;
    uStack_2ce4 = 0xff800000;
    uStack_2ce0 = 0xff800000;
    uStack_2cdc = 0xff800000;
    local_2cd8 = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_2dd8 = local_2e00 + 8;
    local_2e00._0_8_ = local_2848;
    local_2d48 = (avx *)&local_2c48;
    local_2d40 = (anon_class_48_6_afa08d2e *)local_2e00;
    local_2d30 = (undefined1 *)&local_2dd8;
    local_2d28 = &stack0xffffffffffffd1ff;
    local_2d20 = (avx **)&local_2d58;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2d68 = numPrimRefs;
    local_2d58 = (auto_partitioner *)&local_2d68;
    local_2d50 = local_2dd8;
    local_2d38 = &local_2d18;
    local_2cc8.my_node = local_2cd8;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2dd0.func = (anon_class_48_6_afa08d2e *)&local_2d48;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,(unsigned_long)paVar15,1,&local_2dd0,(auto_partitioner *)&stack0xffffffffffffd1fe,
               &local_2cc8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar2 != '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"task cancelled");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    local_2dc8._4_4_ = local_2d18.m128[1];
    local_2dc8._0_4_ = local_2d18.m128[0];
    local_2dc8._8_4_ = local_2d18.m128[2];
    local_2dc8._12_4_ = local_2d18.m128[3];
    local_2dc8._20_4_ = uStack_2d04;
    local_2dc8._16_4_ = local_2d08;
    unique0x1000059a = uStack_2d00;
    unique0x1000059e = uStack_2cfc;
    local_2da8.my_prev_node._4_4_ = uStack_2cf4;
    local_2da8.my_prev_node._0_4_ = local_2cf8;
    local_2da8.my_next_node._0_4_ = uStack_2cf0;
    local_2da8.my_next_node._4_4_ = uStack_2cec;
    local_2d98.my_prev_node._4_4_ = uStack_2ce4;
    local_2d98.my_prev_node._0_4_ = local_2ce8;
    local_2d98.my_next_node._0_4_ = uStack_2ce0;
    local_2d98.my_next_node._4_4_ = uStack_2cdc;
    local_2d88 = local_2cd8;
    if ((anon_class_48_6_afa08d2e *)local_2e00._0_8_ != (anon_class_48_6_afa08d2e *)0x0) {
      piVar9 = (intrusive_list_node *)local_13f8;
      paVar15 = (anon_class_48_6_afa08d2e *)local_2e00._0_8_;
      do {
        *(undefined1 (*) [16])(piVar9 + -4) = local_2dc8._0_16_;
        piVar9[-3] = unique0x1000035e;
        piVar9[-2] = local_2da8;
        piVar9[-1] = local_2d98;
        *piVar9 = local_2d88;
        local_2dc8._0_16_ = vminps_avx(local_2dc8._0_16_,(undefined1  [16])piVar9[-0x144]);
        unique0x000f2b00 =
             (intrusive_list_node)
             vmaxps_avx((undefined1  [16])unique0x1000035e,(undefined1  [16])piVar9[-0x143]);
        local_2da8 = (intrusive_list_node)
                     vminps_avx((undefined1  [16])local_2da8,(undefined1  [16])piVar9[-0x142]);
        local_2d98 = (intrusive_list_node)
                     vmaxps_avx((undefined1  [16])local_2d98,(undefined1  [16])piVar9[-0x141]);
        local_2d88 = (intrusive_list_node)
                     vpaddq_avx((undefined1  [16])local_2d88,(undefined1  [16])piVar9[-0x140]);
        piVar9 = piVar9 + 5;
        paVar15 = (anon_class_48_6_afa08d2e *)((long)(paVar15 + 0xffffffffffffffff) + 0x2f);
      } while (paVar15 != (anon_class_48_6_afa08d2e *)0x0);
    }
  }
  pPVar1 = local_2d70;
  local_2d48 = (avx *)&local_2d60;
  local_2cc8.my_cpu_ctl_env = (uint64_t)local_2d60;
  local_2d18._0_8_ = &local_2cc8;
  createPrimRefArray_presplit<embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::avx::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::avx::createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
            (local_2d70,local_2de0,numPrimRefs,
             (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
              *)local_2dc8,(PrimInfo *)&local_2d18.field_1,(anon_class_8_1_78f12065 *)&local_2d48,
             in_stack_ffffffffffffd1f8);
  return pPVar1;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }